

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::PackSnorm2x16CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,PackSnorm2x16CaseInstance *this)

{
  ulong uVar1;
  Precision PVar2;
  ShaderExecutor *pSVar3;
  deUint32 dVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  Hex<8UL> hex;
  int iVar9;
  ulong uVar10;
  Hex<8UL> hex_00;
  bool bVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  float fVar22;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  ostringstream local_1a8 [376];
  undefined1 auVar20 [16];
  
  dVar4 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&rnd.m_rnd,dVar4 ^ 0x776002);
  inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PVar2 = this->m_precision;
  if (PVar2 == PRECISION_MEDIUMP) {
    uVar5 = 0x21;
  }
  else if (PVar2 == PRECISION_HIGHP) {
    uVar5 = 1;
  }
  else {
    uVar5 = 0x81;
    if (PVar2 != PRECISION_LOWP) {
      uVar5 = 0;
    }
  }
  in = (void *)0x0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0x3f800000bf800000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0xbf0000003f000000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0x3fc00000bfc00000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0xbf4000003e800000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  iVar7 = 0xf;
  while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    in = (void *)CONCAT44(fVar17 * 2.5 + -1.25,fVar16 * 2.5 + -1.25);
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
               (Vector<float,_2> *)&in);
  }
  iVar7 = 0x50;
  while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    in = (void *)CONCAT44(fVar17 * 1e+06 + -500000.0,fVar16 * 1e+06 + -500000.0);
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
               (Vector<float,_2> *)&in);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&outputs,(long)inputs.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)inputs.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
  in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Executing shader for ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," input values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  in = inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  out = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start;
  pSVar3 = (this->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar3->_vptr_ShaderExecutor[2])
            (pSVar3,(ulong)((long)inputs.
                                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)inputs.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar6 = (ulong)((long)inputs.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)inputs.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar7 = (int)uVar6;
  uVar10 = 0;
  if (0 < iVar7) {
    uVar10 = uVar6 & 0xffffffff;
  }
  iVar9 = 0;
  for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
    uVar1 = *(ulong *)inputs.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar6].m_data;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar1;
    auVar19 = minps(ZEXT816(0x3f8000003f800000),auVar19);
    uVar12 = -(uint)((float)uVar1 < -1.0);
    uVar14 = -(uint)((float)(uVar1 >> 0x20) < -1.0);
    fVar16 = (float)(uVar12 & 0xc6fffe00 | ~uVar12 & (uint)(auVar19._0_4_ * 32767.0));
    fVar17 = (float)(uVar14 & 0xc6fffe00 | ~uVar14 & (uint)(auVar19._4_4_ * 32767.0));
    iVar13 = -(uint)(fVar16 < 0.0);
    iVar15 = -(uint)(fVar17 < 0.0);
    auVar21._4_4_ = iVar15;
    auVar21._0_4_ = iVar13;
    auVar21._8_4_ = iVar15;
    auVar21._12_4_ = iVar15;
    auVar20._8_8_ = auVar21._8_8_;
    auVar20._4_4_ = iVar13;
    auVar20._0_4_ = iVar13;
    uVar12 = movmskpd((int)inputs.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,auVar20);
    fVar18 = -0.5;
    if ((uVar12 & 1) == 0) {
      fVar18 = 0.5;
    }
    fVar22 = -0.5;
    if ((uVar12 & 2) == 0) {
      fVar22 = 0.5;
    }
    fVar18 = fVar18 + fVar16;
    fVar16 = -32768.0;
    if (-32768.0 <= fVar18) {
      fVar16 = fVar18;
    }
    fVar18 = 32767.0;
    if (fVar16 <= 32767.0) {
      fVar18 = fVar16;
    }
    fVar17 = fVar17 + fVar22;
    fVar16 = -32768.0;
    if (-32768.0 <= fVar17) {
      fVar16 = fVar17;
    }
    fVar17 = 32767.0;
    if (fVar16 <= 32767.0) {
      fVar17 = fVar16;
    }
    uVar12 = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6];
    hex_00.value._4_4_ = 0;
    hex_00.value._0_4_ = uVar12;
    uVar8 = ((int)fVar18 & 0xffffU) - (uVar12 & 0xffff);
    uVar14 = -uVar8;
    if (0 < (int)uVar8) {
      uVar14 = uVar8;
    }
    uVar8 = ((int)fVar17 & 0xffffU) - (uVar12 >> 0x10);
    uVar12 = -uVar8;
    if (0 < (int)uVar8) {
      uVar12 = uVar8;
    }
    if ((uVar5 < uVar14) || (uVar5 < uVar12)) {
      if (iVar9 < 10) {
        in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"ERROR: Mismatch in value ");
        std::ostream::operator<<(local_1a8,(int)uVar6);
        std::operator<<((ostream *)local_1a8,", expected packSnorm2x16(");
        tcu::operator<<((ostream *)local_1a8,
                        inputs.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar6);
        std::operator<<((ostream *)local_1a8,") = ");
        hex.value._4_4_ = 0;
        hex.value._0_4_ = (int)fVar17 << 0x10 | (int)fVar18 & 0xffffU;
        tcu::Format::operator<<((ostream *)local_1a8,hex);
        std::operator<<((ostream *)local_1a8,", got ");
        tcu::Format::operator<<((ostream *)local_1a8,hex_00);
        std::operator<<((ostream *)local_1a8,"\n  diffs = (");
        std::ostream::operator<<(local_1a8,uVar14);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::operator<<(local_1a8,uVar12);
        std::operator<<((ostream *)local_1a8,"), max diff = ");
        std::ostream::operator<<(local_1a8,uVar5);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      else if (iVar9 == 10) {
        in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      iVar9 = iVar9 + 1;
    }
  }
  in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::operator<<(local_1a8,iVar7 - iVar9);
  std::operator<<((ostream *)local_1a8," / ");
  std::ostream::operator<<(local_1a8,iVar7);
  std::operator<<((ostream *)local_1a8," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  if (iVar9 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&in,"Pass",(allocator<char> *)&out)
    ;
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&in);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&in,"Result comparison failed",(allocator<char> *)&out);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&in);
  }
  std::__cxx11::string::~string((string *)&in);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&inputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1		:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 33	:		// (2^-10) * (2^15) + 1
												  m_precision == glu::PRECISION_LOWP	? 129	: 0;	// (2^-8) * (2^15) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(-1.0f, 1.0f));
		inputs.push_back(tcu::Vec2(0.5f, -0.5f));
		inputs.push_back(tcu::Vec2(-1.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, -0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint16	ref1	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}